

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  Curl_easy *pCVar2;
  bool bVar3;
  CURLcode CVar4;
  short *psVar5;
  size_t sVar6;
  size_t sVar7;
  curl_write_callback p_Var8;
  short *psVar9;
  char *pcVar10;
  curl_write_callback p_Var11;
  ulong uVar12;
  CURLcode local_58;
  
  pCVar2 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    if ((pCVar2->state).prev_block_had_trailing_cr == true) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(pCVar2->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
      }
      (pCVar2->state).prev_block_had_trailing_cr = false;
    }
    psVar5 = (short *)memchr(ptr,0xd,len);
    if (psVar5 != (short *)0x0) {
      for (psVar9 = psVar5; psVar9 < ptr + (len - 1); psVar9 = (short *)((long)psVar9 + 1)) {
        if (*psVar9 == 0xa0d) {
          pcVar10 = (char *)((long)psVar9 + 1);
          psVar9 = (short *)((long)psVar9 + 1);
          *(char *)psVar5 = *pcVar10;
          pcVar1 = &(pCVar2->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar9 == '\r') {
          *(char *)psVar5 = '\n';
        }
        else {
          *(char *)psVar5 = (char)*psVar9;
        }
        psVar5 = (short *)((long)psVar5 + 1);
      }
      if (psVar9 < ptr + len) {
        if ((char)*psVar9 == '\r') {
          *(char *)psVar5 = '\n';
          (pCVar2->state).prev_block_had_trailing_cr = true;
        }
        else {
          *(char *)psVar5 = (char)*psVar9;
        }
        psVar5 = (short *)((long)psVar5 + 1);
      }
      if (psVar5 < ptr + len) {
        *(char *)psVar5 = '\0';
      }
      len = (long)psVar5 - (long)ptr;
    }
  }
  if (len == 0) {
LAB_00114287:
    local_58 = CURLE_OK;
  }
  else {
    pCVar2 = conn->data;
    if (((pCVar2->req).keepon & 0x10) != 0) {
      CVar4 = pausewrite(pCVar2,type,ptr,len);
      return CVar4;
    }
    if ((type & 1U) == 0) {
      p_Var11 = (curl_write_callback)0x0;
    }
    else {
      p_Var11 = (pCVar2->set).fwrite_func;
    }
    pcVar10 = ptr;
    uVar12 = len;
    if ((type & 2U) == 0) {
      p_Var8 = (curl_write_callback)0x0;
    }
    else {
      p_Var8 = (pCVar2->set).fwrite_header;
      if (p_Var8 == (curl_write_callback)0x0) {
        if ((pCVar2->set).writeheader == (void *)0x0) {
          p_Var8 = (curl_write_callback)0x0;
        }
        else {
          p_Var8 = (pCVar2->set).fwrite_func;
        }
      }
    }
    do {
      if (uVar12 == 0) {
        if (p_Var8 != (curl_write_callback)0x0) {
          Curl_set_in_callback(pCVar2,true);
          sVar7 = (*p_Var8)(ptr,1,len,(pCVar2->set).writeheader);
          Curl_set_in_callback(pCVar2,false);
          if (sVar7 == 0x10000001) {
            local_58 = pausewrite(pCVar2,2,ptr,len);
            bVar3 = false;
          }
          else {
            bVar3 = true;
            if (sVar7 != len) {
              bVar3 = false;
              Curl_failf(pCVar2,"Failed writing header");
              local_58 = CURLE_WRITE_ERROR;
            }
          }
          if (!bVar3) {
            return local_58;
          }
        }
        goto LAB_00114287;
      }
      sVar7 = 0x4000;
      if (uVar12 < 0x4000) {
        sVar7 = uVar12;
      }
      if (p_Var11 == (curl_write_callback)0x0) {
LAB_001141dd:
        pcVar10 = pcVar10 + sVar7;
        uVar12 = uVar12 - sVar7;
        bVar3 = true;
      }
      else {
        sVar6 = (*p_Var11)(pcVar10,1,sVar7,(pCVar2->set).out);
        if (sVar6 == 0x10000001) {
          if ((conn->handler->flags & 0x10) == 0) {
            local_58 = pausewrite(pCVar2,type,pcVar10,uVar12);
            bVar3 = false;
          }
          else {
            Curl_failf(pCVar2,"Write callback asked for PAUSE when not supported!");
LAB_001141d1:
            bVar3 = false;
            local_58 = CURLE_WRITE_ERROR;
          }
        }
        else {
          bVar3 = true;
          if (sVar6 != sVar7) {
            Curl_failf(pCVar2,"Failed writing body (%zu != %zu)",sVar6,sVar7);
            goto LAB_001141d1;
          }
        }
        if (bVar3) goto LAB_001141dd;
        bVar3 = false;
      }
    } while (bVar3);
  }
  return local_58;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return chop_write(conn, type, ptr, len);
}